

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O3

ma_result ma_decoder_seek_to_pcm_frame(ma_decoder *pDecoder,ma_uint64 frameIndex)

{
  long *plVar1;
  ma_resampling_backend_vtable *pmVar2;
  _func_ma_result_void_ptr_ma_resampling_backend_ptr *p_Var3;
  ma_result mVar4;
  int iVar5;
  ma_uint64 mVar6;
  ulong uVar7;
  ma_uint32 sampleRate;
  ma_format format;
  ma_uint32 channels;
  ma_uint32 local_3c;
  ulong local_38;
  undefined1 local_2c [4];
  
  mVar4 = MA_INVALID_ARGS;
  if ((pDecoder != (ma_decoder *)0x0) &&
     (plVar1 = (long *)pDecoder->pBackend, plVar1 != (long *)0x0)) {
    if (*(code **)(*plVar1 + 0x10) == (code *)0x0) {
      mVar4 = MA_NOT_IMPLEMENTED;
    }
    else {
      mVar4 = (**(code **)(*plVar1 + 0x10))(plVar1,&local_38,local_2c,&local_3c,0,0);
      if (mVar4 == MA_SUCCESS) {
        mVar6 = frameIndex;
        if (local_3c != pDecoder->outputSampleRate) {
          mVar6 = ma_calculate_frame_count_after_resampling
                            (local_3c,pDecoder->outputSampleRate,frameIndex);
        }
        plVar1 = (long *)pDecoder->pBackend;
        mVar4 = MA_SUCCESS;
        if (((plVar1 == (long *)0x0) || (*(code **)(*plVar1 + 0x18) == (code *)0x0)) ||
           (iVar5 = (**(code **)(*plVar1 + 0x18))(plVar1,&local_38), iVar5 != 0)) {
          uVar7 = 0;
        }
        else {
          uVar7 = 0;
          if ((ulong)plVar1[1] <= local_38) {
            uVar7 = local_38 - plVar1[1];
          }
        }
        if (uVar7 != mVar6) {
          plVar1 = (long *)pDecoder->pBackend;
          if (plVar1 == (long *)0x0) {
            mVar4 = MA_INVALID_ARGS;
          }
          else if (*(code **)(*plVar1 + 8) == (code *)0x0) {
            mVar4 = MA_NOT_IMPLEMENTED;
          }
          else {
            mVar4 = MA_INVALID_OPERATION;
            if ((mVar6 <= (ulong)plVar1[2]) &&
               (mVar4 = (**(code **)(*plVar1 + 8))(plVar1,mVar6 + plVar1[1]), mVar4 == MA_SUCCESS))
            {
              pDecoder->readPointerInPCMFrames = frameIndex;
              mVar4 = MA_SUCCESS;
            }
          }
          if ((((pDecoder->converter).hasResampler != '\0') &&
              (pmVar2 = (pDecoder->converter).resampler.pBackendVTable,
              pmVar2 != (ma_resampling_backend_vtable *)0x0)) &&
             (p_Var3 = pmVar2->onReset,
             p_Var3 != (_func_ma_result_void_ptr_ma_resampling_backend_ptr *)0x0)) {
            (*p_Var3)((pDecoder->converter).resampler.pBackendUserData,
                      (pDecoder->converter).resampler.pBackend);
          }
        }
      }
    }
  }
  return mVar4;
}

Assistant:

MA_API ma_result ma_decoder_seek_to_pcm_frame(ma_decoder* pDecoder, ma_uint64 frameIndex)
{
    if (pDecoder == NULL) {
        return MA_INVALID_ARGS;
    }

    if (pDecoder->pBackend != NULL) {
        ma_result result;
        ma_uint64 internalFrameIndex;
        ma_uint32 internalSampleRate;
        ma_uint64 currentFrameIndex;

        result = ma_data_source_get_data_format(pDecoder->pBackend, NULL, NULL, &internalSampleRate, NULL, 0);
        if (result != MA_SUCCESS) {
            return result;  /* Failed to retrieve the internal sample rate. */
        }

        if (internalSampleRate == pDecoder->outputSampleRate) {
            internalFrameIndex = frameIndex;
        } else {
            internalFrameIndex = ma_calculate_frame_count_after_resampling(internalSampleRate, pDecoder->outputSampleRate, frameIndex);
        }

        /* Only seek if we're requesting a different frame to what we're currently sitting on. */
        ma_data_source_get_cursor_in_pcm_frames(pDecoder->pBackend, &currentFrameIndex);
        if (currentFrameIndex != internalFrameIndex) {
            result = ma_data_source_seek_to_pcm_frame(pDecoder->pBackend, internalFrameIndex);
            if (result == MA_SUCCESS) {
                pDecoder->readPointerInPCMFrames = frameIndex;
            }

            /* Reset the data converter so that any cached data in the resampler is cleared. */
            ma_data_converter_reset(&pDecoder->converter);
        }

        return result;
    }

    /* Should never get here, but if we do it means onSeekToPCMFrame was not set by the backend. */
    return MA_INVALID_ARGS;
}